

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDefaultCollisionConfiguration.cpp
# Opt level: O1

cbtCollisionAlgorithmCreateFunc * __thiscall
cbtDefaultCollisionConfiguration::getClosestPointsAlgorithmCreateFunc
          (cbtDefaultCollisionConfiguration *this,int proxyType0,int proxyType1)

{
  long lVar1;
  
  lVar1 = 0x70;
  if (((((((proxyType0 ^ 8U) != 0 || (proxyType1 ^ 8U) != 0) &&
         (lVar1 = 0x90, (proxyType0 ^ 8U) != 0 || proxyType1 != 1)) &&
        (lVar1 = 0x98, proxyType0 != 1 || (proxyType1 ^ 8U) != 0)) &&
       ((lVar1 = 0xa8, 0x17 < proxyType0 || proxyType1 != 0x22 &&
        (lVar1 = 0xa0, proxyType0 != 0x22 || 0x17 < proxyType1)))) &&
      ((lVar1 = 0x38, 0x17 < proxyType0 || 0x17 < proxyType1 &&
       ((lVar1 = 0x40, 0x17 < proxyType0 || 10 < proxyType1 - 0x19U &&
        (lVar1 = 0x48, 0x17 < proxyType1 || 10 < proxyType0 - 0x19U)))))) &&
     (lVar1 = (ulong)(proxyType1 == 0x25) * 8 + 0x50, proxyType0 != 0x25)) {
    lVar1 = (ulong)(proxyType1 != 0x25) * 8 + 0x60;
  }
  return *(cbtCollisionAlgorithmCreateFunc **)
          ((long)&(this->super_cbtCollisionConfiguration)._vptr_cbtCollisionConfiguration + lVar1);
}

Assistant:

cbtCollisionAlgorithmCreateFunc* cbtDefaultCollisionConfiguration::getClosestPointsAlgorithmCreateFunc(int proxyType0, int proxyType1)
{
	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1 == SPHERE_SHAPE_PROXYTYPE))
	{
		return m_sphereSphereCF;
	}
#ifdef USE_BUGGY_SPHERE_BOX_ALGORITHM
	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1 == BOX_SHAPE_PROXYTYPE))
	{
		return m_sphereBoxCF;
	}

	if ((proxyType0 == BOX_SHAPE_PROXYTYPE) && (proxyType1 == SPHERE_SHAPE_PROXYTYPE))
	{
		return m_boxSphereCF;
	}
#endif  //USE_BUGGY_SPHERE_BOX_ALGORITHM

	if ((proxyType0 == SPHERE_SHAPE_PROXYTYPE) && (proxyType1 == TRIANGLE_SHAPE_PROXYTYPE))
	{
		return m_sphereTriangleCF;
	}

	if ((proxyType0 == TRIANGLE_SHAPE_PROXYTYPE) && (proxyType1 == SPHERE_SHAPE_PROXYTYPE))
	{
		return m_triangleSphereCF;
	}

	if (cbtBroadphaseProxy::isConvex(proxyType0) && (proxyType1 == STATIC_PLANE_PROXYTYPE))
	{
		return m_convexPlaneCF;
	}

	if (cbtBroadphaseProxy::isConvex(proxyType1) && (proxyType0 == STATIC_PLANE_PROXYTYPE))
	{
		return m_planeConvexCF;
	}

	if (cbtBroadphaseProxy::isConvex(proxyType0) && cbtBroadphaseProxy::isConvex(proxyType1))
	{
		return m_convexConvexCreateFunc;
	}

	if (cbtBroadphaseProxy::isConvex(proxyType0) && cbtBroadphaseProxy::isConcave(proxyType1))
	{
		return m_convexConcaveCreateFunc;
	}

	if (cbtBroadphaseProxy::isConvex(proxyType1) && cbtBroadphaseProxy::isConcave(proxyType0))
	{
		return m_swappedConvexConcaveCreateFunc;
	}

	if (cbtBroadphaseProxy::isCompound(proxyType0) && cbtBroadphaseProxy::isCompound(proxyType1))
	{
		return m_compoundCompoundCreateFunc;
	}

	if (cbtBroadphaseProxy::isCompound(proxyType0))
	{
		return m_compoundCreateFunc;
	}
	else
	{
		if (cbtBroadphaseProxy::isCompound(proxyType1))
		{
			return m_swappedCompoundCreateFunc;
		}
	}

	//failed to find an algorithm
	return m_emptyCreateFunc;
}